

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeConditionalWrapper.cpp
# Opt level: O0

Statement * __thiscall
IRT::RelativeConditionalWrapper::ToConditional
          (RelativeConditionalWrapper *this,Label *true_label,Label *false_label)

{
  LogicOperatorType type;
  Expression *left;
  Expression *right;
  JumpConditionalStatement *this_00;
  Label local_70;
  Label local_40;
  Label *local_20;
  Label *false_label_local;
  Label *true_label_local;
  RelativeConditionalWrapper *this_local;
  
  local_20 = false_label;
  false_label_local = true_label;
  true_label_local = (Label *)this;
  this_00 = (JumpConditionalStatement *)operator_new(0x60);
  type = this->operator_type_;
  left = this->lhs_;
  right = this->rhs_;
  Label::Label(&local_40,true_label);
  Label::Label(&local_70,false_label);
  JumpConditionalStatement::JumpConditionalStatement(this_00,type,left,right,&local_40,&local_70);
  Label::~Label(&local_70);
  Label::~Label(&local_40);
  return &this_00->super_Statement;
}

Assistant:

Statement *RelativeConditionalWrapper::ToConditional(Label true_label, Label false_label) {
    return new JumpConditionalStatement(
        operator_type_,
        lhs_,
        rhs_,
        true_label,
        false_label
    );
}